

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.cpp
# Opt level: O2

uint32_t net_uv::net_getBufHash(void *buf,uint32_t len)

{
  uint uVar1;
  long lVar2;
  char *str;
  
  uVar1 = 0;
  for (lVar2 = 0; len != (uint32_t)lVar2; lVar2 = lVar2 + 1) {
    uVar1 = (int)*(char *)((long)buf + lVar2) + uVar1 * 0x83;
  }
  return uVar1 & 0x7fffffff;
}

Assistant:

uint32_t net_getBufHash(const void *buf, uint32_t len)
{
	uint32_t seed = 131; // 31 131 1313 13131 131313 etc..
	uint32_t hash = 0;
	uint32_t i = 0;
	char *str = (char *)buf;
	while (i < len)
	{
		hash = hash * seed + (*str++);
		++i;
	}

	return (hash & 0x7FFFFFFF);
}